

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void AnalyzeClassBaseElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  TypeClass *pTVar1;
  IntrusiveList<SynConstant> constants;
  bool bVar2;
  ExprAliasDefinition *pEVar3;
  MatchData *this;
  ExprVariableDefinitions *pEVar4;
  ExprVariableDefinition *pEVar5;
  SynVariableDefinition *pSVar6;
  MemberHandle *this_00;
  TypeBase *type_00;
  SynBase *local_b8;
  SynClassStaticIf *local_80;
  SynClassStaticIf *staticIf;
  TypeBase *type;
  SynConstantSet *constantSet;
  SynVariableDefinition *sourceDefinition;
  ExprVariableDefinition *variableDefinition;
  ExprBase *definition;
  ExprVariableDefinitions *node;
  SynVariableDefinitions *member;
  ExprAliasDefinition *alias;
  SynTypedef *typeDef;
  SynClassElements *syntax_local;
  ExprClassDefinition *classDefinition_local;
  ExpressionContext *ctx_local;
  
  for (alias = (ExprAliasDefinition *)(syntax->typedefs).head; alias != (ExprAliasDefinition *)0x0;
      alias = (ExprAliasDefinition *)getType<SynTypedef>((SynBase *)alias->alias)) {
    pEVar3 = AnalyzeTypedef(ctx,(SynTypedef *)alias);
    pTVar1 = classDefinition->classType;
    this = ExpressionContext::get<MatchData>(ctx);
    MatchData::MatchData(this,pEVar3->alias->name,pEVar3->alias->type);
    IntrusiveList<MatchData>::push_back(&pTVar1->aliases,this);
  }
  node = (ExprVariableDefinitions *)(syntax->members).head;
  do {
    if (node == (ExprVariableDefinitions *)0x0) {
      for (type = (TypeBase *)(syntax->constantSets).head; type != (TypeBase *)0x0;
          type = (TypeBase *)getType<SynConstantSet>((SynBase *)type->size)) {
        type_00 = AnalyzeType(ctx,(SynBase *)type->refType,true,(bool *)0x0);
        constants.head = (SynConstant *)(type->arrayTypes).head;
        constants.tail = (SynConstant *)(type->arrayTypes).tail;
        AnalyzeClassConstants
                  (ctx,(SynBase *)type,type_00,constants,
                   &(classDefinition->classType->super_TypeStruct).constants);
      }
      for (local_80 = (syntax->staticIfs).head; local_80 != (SynClassStaticIf *)0x0;
          local_80 = getType<SynClassStaticIf>((local_80->super_SynBase).next)) {
        AnalyzeClassStaticIf(ctx,classDefinition,local_80,true);
      }
      return;
    }
    pEVar4 = AnalyzeVariableDefinitions(ctx,(SynVariableDefinitions *)node);
    for (variableDefinition = (ExprVariableDefinition *)(pEVar4->definitions).head;
        variableDefinition != (ExprVariableDefinition *)0x0;
        variableDefinition = (ExprVariableDefinition *)(variableDefinition->super_ExprBase).next) {
      bVar2 = isType<TypeError>((variableDefinition->super_ExprBase).type);
      if (!bVar2) {
        pEVar5 = getType<ExprVariableDefinition>(&variableDefinition->super_ExprBase);
        if (pEVar5 == (ExprVariableDefinition *)0x0) {
          __assert_fail("variableDefinition",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x28f9,
                        "void AnalyzeClassBaseElements(ExpressionContext &, ExprClassDefinition *, SynClassElements *)"
                       );
        }
        pSVar6 = getType<SynVariableDefinition>((variableDefinition->super_ExprBase).source);
        pTVar1 = classDefinition->classType;
        this_00 = ExpressionContext::get<MemberHandle>(ctx);
        if (pSVar6 == (SynVariableDefinition *)0x0) {
          local_b8 = (SynBase *)0x0;
        }
        else {
          local_b8 = pSVar6->initializer;
        }
        MemberHandle::MemberHandle
                  (this_00,pEVar5->variable->source,pEVar5->variable->variable,local_b8);
        IntrusiveList<MemberHandle>::push_back(&(pTVar1->super_TypeStruct).members,this_00);
      }
    }
    node = (ExprVariableDefinitions *)
           getType<SynVariableDefinitions>((SynBase *)node->definitionType);
  } while( true );
}

Assistant:

void AnalyzeClassBaseElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	for(SynTypedef *typeDef = syntax->typedefs.head; typeDef; typeDef = getType<SynTypedef>(typeDef->next))
	{
		ExprAliasDefinition *alias = AnalyzeTypedef(ctx, typeDef);

		classDefinition->classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(alias->alias->name, alias->alias->type));
	}

	{
		for(SynVariableDefinitions *member = syntax->members.head; member; member = getType<SynVariableDefinitions>(member->next))
		{
			ExprVariableDefinitions *node = AnalyzeVariableDefinitions(ctx, member);

			for(ExprBase *definition = node->definitions.head; definition; definition = definition->next)
			{
				if(isType<TypeError>(definition->type))
					continue;

				ExprVariableDefinition *variableDefinition = getType<ExprVariableDefinition>(definition);

				assert(variableDefinition);

				SynVariableDefinition *sourceDefinition = getType<SynVariableDefinition>(definition->source);

				classDefinition->classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(variableDefinition->variable->source, variableDefinition->variable->variable, sourceDefinition ? sourceDefinition->initializer : NULL));
			}
		}
	}

	for(SynConstantSet *constantSet = syntax->constantSets.head; constantSet; constantSet = getType<SynConstantSet>(constantSet->next))
	{
		TypeBase *type = AnalyzeType(ctx, constantSet->type);

		AnalyzeClassConstants(ctx, constantSet, type, constantSet->constants, classDefinition->classType->constants);
	}

	// TODO: The way SynClassElements is made, it could allow member re-ordering! class should contain in-order members and static if's
	// TODO: We should be able to analyze all static if typedefs before members and constants and analyze them before functions
	for(SynClassStaticIf *staticIf = syntax->staticIfs.head; staticIf; staticIf = getType<SynClassStaticIf>(staticIf->next))
		AnalyzeClassStaticIf(ctx, classDefinition, staticIf, true);
}